

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O1

void __thiscall xe::TestLogParser::reset(TestLogParser *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ContainerFormatParser::clear(&this->m_containerParser);
  pSVar2 = (this->m_currentCaseData).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_currentCaseData).m_ptr = (TestCaseResultData *)0x0;
      (*((this->m_currentCaseData).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_currentCaseData).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_currentCaseData).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_currentCaseData).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  (this->m_currentCaseData).m_ptr = (TestCaseResultData *)0x0;
  (this->m_currentCaseData).m_state = (SharedPtrStateBase *)0x0;
  memset((SessionInfo *)local_110,0,0xe0);
  local_110._0_8_ = local_110 + 0x10;
  local_110._8_8_ = 0;
  local_110[0x10] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->m_sessionInfo,(string *)local_110);
  std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).releaseId,(string *)&local_f0);
  std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).targetName,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(this->m_sessionInfo).candyTargetName,(string *)&local_b0);
  std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).configName,(string *)&local_90);
  std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).resultName,(string *)&local_70);
  std::__cxx11::string::operator=((string *)&(this->m_sessionInfo).timestamp,(string *)&local_50);
  SessionInfo::~SessionInfo((SessionInfo *)local_110);
  this->m_inSession = false;
  return;
}

Assistant:

void TestLogParser::reset (void)
{
	m_containerParser.clear();
	m_currentCaseData.clear();
	m_sessionInfo	= SessionInfo();
	m_inSession		= false;
}